

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSNode.h
# Opt level: O2

bool __thiscall dg::pta::PSNodeRet::addReturnSite(PSNodeRet *this,PSNode *r)

{
  pointer ppPVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  PSNode *local_18;
  
  ppPVar1 = (this->returns).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppPVar2 = (this->returns).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppPVar3 = ppPVar2;
    if (ppPVar3 == ppPVar1) {
      local_18 = r;
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                (&this->returns,&local_18);
      break;
    }
    ppPVar2 = ppPVar3 + 1;
  } while (*ppPVar3 != r);
  return ppPVar3 == ppPVar1;
}

Assistant:

bool addReturnSite(PSNode *r) {
        // we suppose there are just few callees,
        // so this should be faster than std::set
        for (PSNode *p : returns) {
            if (p == r)
                return false;
        }

        returns.push_back(r);
        return true;
    }